

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlRpcValue.cpp
# Opt level: O0

void __thiscall XmlRpc::XmlRpcValue::assertTypeOrInvalid(XmlRpcValue *this,Type t)

{
  undefined8 uVar1;
  int in_ESI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string *message;
  XmlRpcException *in_stack_ffffffffffffff80;
  allocator<char> *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  string local_31;
  
  if (*(int *)in_RDI == 0) {
    *(int *)in_RDI = in_ESI;
    if (*(int *)in_RDI - 4U < 5) {
      (*(code *)(&DAT_00585ce4 + *(int *)(&DAT_00585ce4 + (ulong)(*(int *)in_RDI - 4U) * 4)))();
      return;
    }
    in_RDI->_M_string_length = 0;
  }
  else if (*(int *)in_RDI != in_ESI) {
    uVar1 = __cxa_allocate_exception(0x28);
    message = &local_31;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_RDI,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    XmlRpcException::XmlRpcException(in_stack_ffffffffffffff80,message,(int)((ulong)uVar1 >> 0x20));
    __cxa_throw(uVar1,&XmlRpcException::typeinfo,XmlRpcException::~XmlRpcException);
  }
  return;
}

Assistant:

void XmlRpcValue::assertTypeOrInvalid(Type t)
  {
    if (_type == TypeInvalid)
    {
      _type = t;
      switch (_type) {    // Ensure there is a valid value for the type
        case TypeString:   _value.asString = new std::string(); break;
        case TypeDateTime: _value.asTime = new struct tm();     break;
        case TypeBase64:   _value.asBinary = new BinaryData();  break;
        case TypeArray:    _value.asArray = new ValueArray();   break;
        case TypeStruct:   _value.asStruct = new ValueStruct(); break;
        default:           _value.asBinary = 0; break;
      }
    }
    else if (_type != t)
      throw XmlRpcException("type error");
  }